

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

Client * __thiscall Server::Private::pair(Private *this,ICallback *callback,Socket *otherSocket)

{
  bool bVar1;
  int size;
  ClientImpl *client;
  Socket local_2c;
  Socket *pSStack_28;
  Socket socket;
  Socket *otherSocket_local;
  ICallback *callback_local;
  Private *this_local;
  Socket *pSVar2;
  
  pSStack_28 = otherSocket;
  Socket::Socket(&local_2c);
  pSVar2 = pSStack_28;
  bVar1 = Socket::pair(&local_2c,pSStack_28);
  size = (int)pSVar2;
  if ((((bVar1) && (bVar1 = Socket::setNonBlocking(&local_2c), bVar1)) &&
      (((this->_keepAlive & 1U) == 0 || (bVar1 = Socket::setKeepAlive(&local_2c), bVar1)))) &&
     (((this->_noDelay & 1U) == 0 || (bVar1 = Socket::setNoDelay(&local_2c), bVar1)))) {
    if (0 < this->_sendBufferSize) {
      size = this->_sendBufferSize;
      bVar1 = Socket::setSendBufferSize(&local_2c,size);
      if (!bVar1) goto LAB_001211b2;
    }
    if (0 < this->_receiveBufferSize) {
      size = this->_receiveBufferSize;
      bVar1 = Socket::setReceiveBufferSize(&local_2c,size);
      if (!bVar1) goto LAB_001211b2;
    }
    this_local = (Private *)
                 PoolList<Server::Private::ClientImpl>::append<Server::Private&>
                           (&this->_clients,this);
    *(ICallback **)&this_local->_receiveBufferSize = callback;
    Socket::swap((Socket *)this_local,&local_2c);
    Socket::Poll::set(&this->_sockets,(Socket *)this_local,1);
  }
  else {
LAB_001211b2:
    Socket::close(pSStack_28,size);
    this_local = (Private *)0x0;
  }
  Socket::~Socket(&local_2c);
  return (Client *)this_local;
}

Assistant:

Server::Client *Server::Private::pair(Client::ICallback &callback, Socket &otherSocket)
{
  Socket socket;
  if (!socket.pair(otherSocket) ||
      !socket.setNonBlocking() ||
      (_keepAlive && !socket.setKeepAlive()) ||
      (_noDelay && !socket.setNoDelay()) ||
      (_sendBufferSize > 0 && !socket.setSendBufferSize(_sendBufferSize)) ||
      (_receiveBufferSize > 0 && !socket.setReceiveBufferSize(_receiveBufferSize)))
  {
    otherSocket.close();
    return 0;
  }
  ClientImpl &client = _clients.append<Server::Private &>(*this);
  client._callback = &callback;
  client.swap(socket);
  _sockets.set(client, Socket::Poll::readFlag);
  return (Server::Client *)&client;
}